

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImGuiViewportP *viewport,ImDrawList *draw_list,char *label)

{
  ImGuiWindow *pIVar1;
  ImDrawVert *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ImDrawList *pIVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  uint uVar12;
  unsigned_short *puVar13;
  ulong uVar14;
  ImVec4 *buf_00;
  int iVar15;
  ImDrawCmd *pIVar16;
  undefined4 uVar17;
  float fVar18;
  ImGuiListClipper clipper;
  ImVec2 triangle_1 [3];
  char buf [300];
  ImGuiListClipper local_1d8;
  ImDrawList *local_1b8;
  ImDrawCmd *local_1b0;
  uint local_1a4;
  ulong local_1a0;
  ulong local_198;
  ImVec2 local_190;
  ImVec2 local_188 [4];
  ImVec4 local_168 [18];
  undefined1 local_3c [12];
  
  pcVar10 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar10 = draw_list->_OwnerName;
  }
  bVar4 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar10,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,(draw_list->CmdBuffer).Size);
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->DrawList == draw_list) {
    pIVar1->WriteAccessed = true;
    if (pIVar1->SkipItems == false) {
      (pIVar1->DC).CursorPos.x = (pIVar3->Style).ItemSpacing.x + (pIVar1->DC).CursorPosPrevLine.x;
      (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
      (pIVar1->DC).CurrLineSize = (pIVar1->DC).PrevLineSize;
      (pIVar1->DC).CurrLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
    }
    local_168[0].x = 1.0;
    local_168[0].y = 0.4;
    local_168[0].z = 0.4;
    local_168[0].w = 1.0;
    TextColored(local_168,"CURRENTLY APPENDING");
    if (!bVar4) {
      return;
    }
  }
  else {
    if (viewport == (ImGuiViewportP *)0x0) {
      pIVar8 = (ImDrawList *)0x0;
    }
    else {
      pIVar8 = GetViewportDrawList(viewport,1,"##Foreground");
    }
    if ((pIVar8 != (ImDrawList *)0x0 && window != (ImGuiWindow *)0x0) &&
       (bVar5 = IsItemHovered(0), bVar5)) {
      local_168[0].y = (window->Pos).y + (window->Size).y;
      local_168[0].x = (window->Pos).x + (window->Size).x;
      ImDrawList::AddRect(pIVar8,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0xf,1.0);
    }
    if (!bVar4) {
      return;
    }
    if ((window != (ImGuiWindow *)0x0) && (window->WasActive == false)) {
      TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
    }
    if (0 < (draw_list->CmdBuffer).Size) {
      pIVar16 = (draw_list->CmdBuffer).Data;
      uVar14 = 0;
      local_1b8 = pIVar8;
      do {
        if (pIVar16->UserCallback == (ImDrawCallback)0x0) {
          if (pIVar16->ElemCount != 0) {
            if ((draw_list->IdxBuffer).Size < 1) {
              puVar13 = (unsigned_short *)0x0;
            }
            else {
              puVar13 = (draw_list->IdxBuffer).Data;
            }
            ImFormatString((char *)local_168,300,
                           "DrawCmd:%5d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                           SUB84((double)(pIVar16->ClipRect).x,0),
                           SUB84((double)(pIVar16->ClipRect).y,0),(double)(pIVar16->ClipRect).z,
                           (double)(pIVar16->ClipRect).w,(ulong)pIVar16->ElemCount / 3,
                           pIVar16->TextureId);
            bVar4 = TreeNode((void *)(((long)pIVar16 - (long)(draw_list->CmdBuffer).Data >> 3) *
                                     0x6db6db6db6db6db7),"%s",local_168);
            bVar5 = IsItemHovered(0);
            uVar7 = (uint)uVar14;
            if (bVar5) {
              if (show_drawcmd_mesh == false) {
                if ((local_1b8 != (ImDrawList *)0x0) && (show_drawcmd_aabb != false))
                goto LAB_00146668;
              }
              else if (local_1b8 != (ImDrawList *)0x0) {
LAB_00146668:
                NodeDrawCmdShowMeshAndBoundingBox
                          (local_1b8,draw_list,pIVar16,uVar7,show_drawcmd_mesh,show_drawcmd_aabb);
              }
            }
            pIVar8 = local_1b8;
            if (bVar4) {
              uVar12 = pIVar16->ElemCount;
              uVar17 = 0;
              if (uVar7 < uVar12 + uVar7) {
                iVar15 = (draw_list->VtxBuffer).Size;
                fVar18 = 0.0;
                uVar11 = uVar14;
                do {
                  local_1d8.DisplayStart = 0;
                  local_1d8.DisplayEnd = 0;
                  local_1d8.ItemsCount = 0;
                  local_1d8.StepNo = 0;
                  local_1d8.ItemsHeight = 0.0;
                  local_1d8.StartPosY = 0.0;
                  lVar9 = 0;
                  do {
                    uVar12 = (uint)(uVar11 + lVar9);
                    if (puVar13 != (unsigned_short *)0x0) {
                      uVar12 = (uint)puVar13[uVar11 + lVar9 & 0xffffffff];
                    }
                    if (((int)uVar12 < 0) || (iVar15 <= (int)uVar12)) {
LAB_00146a07:
                      __assert_fail("i >= 0 && i < Size",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                                    ,0x5c2,
                                    "T &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]");
                    }
                    *(ImVec2 *)(&local_1d8.DisplayStart + lVar9 * 2) =
                         (draw_list->VtxBuffer).Data[uVar12].pos;
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  fVar18 = fVar18 + ABS(((float)local_1d8.DisplayEnd - (float)local_1d8.StepNo) *
                                        local_1d8.ItemsHeight +
                                        ((float)local_1d8.StepNo - local_1d8.StartPosY) *
                                        (float)local_1d8.DisplayStart +
                                        (local_1d8.StartPosY - (float)local_1d8.DisplayEnd) *
                                        (float)local_1d8.ItemsCount) * 0.5;
                  uVar11 = uVar11 + 3;
                  uVar12 = pIVar16->ElemCount;
                } while ((uint)uVar11 < uVar12 + uVar7);
                uVar17 = SUB84((double)fVar18,0);
              }
              bVar5 = local_1b8 != (ImDrawList *)0x0;
              local_1b0 = pIVar16;
              ImFormatString((char *)local_168,300,
                             "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                             uVar17,(ulong)uVar12,(ulong)pIVar16->VtxOffset);
              local_1d8.DisplayStart = 0;
              local_1d8.DisplayEnd = 0;
              Selectable((char *)local_168,false,0,(ImVec2 *)&local_1d8);
              bVar4 = IsItemHovered(0);
              pIVar16 = local_1b0;
              if (bVar5 && bVar4) {
                NodeDrawCmdShowMeshAndBoundingBox(pIVar8,draw_list,local_1b0,uVar7,true,false);
              }
              local_1d8.StartPosY = (GImGui->CurrentWindow->DC).CursorPos.y;
              local_1d8.ItemsCount = pIVar16->ElemCount / 3;
              local_1d8.StepNo = 0;
              local_1d8.ItemsHeight = -1.0;
              local_1d8.DisplayStart = -1;
              local_1d8.DisplayEnd = 0;
              local_1a0 = uVar14;
              while (bVar4 = ImGuiListClipper::Step(&local_1d8), bVar4) {
                local_1a4 = local_1d8.DisplayEnd;
                if (local_1d8.DisplayStart < local_1d8.DisplayEnd) {
                  iVar15 = local_1d8.DisplayStart * 3 + (int)local_1a0;
                  uVar7 = local_1d8.DisplayStart;
                  do {
                    local_198 = (ulong)uVar7;
                    local_188[0].x = 0.0;
                    local_188[0].y = 0.0;
                    local_188[1].x = 0.0;
                    local_188[1].y = 0.0;
                    local_188[2].x = 0.0;
                    local_188[2].y = 0.0;
                    lVar9 = 0;
                    buf_00 = local_168;
                    do {
                      if (puVar13 == (unsigned_short *)0x0) {
                        uVar7 = iVar15 + (int)lVar9;
                      }
                      else {
                        uVar7 = (uint)puVar13[iVar15 + lVar9];
                      }
                      if (((int)uVar7 < 0) || ((draw_list->VtxBuffer).Size <= (int)uVar7))
                      goto LAB_00146a07;
                      pIVar2 = (draw_list->VtxBuffer).Data;
                      local_188[lVar9] = pIVar2[uVar7].pos;
                      pcVar10 = "     ";
                      if (lVar9 == 0) {
                        pcVar10 = "Vert:";
                      }
                      iVar6 = ImFormatString((char *)buf_00,(size_t)(local_3c + -(long)buf_00),
                                             "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n"
                                             ,SUB84((double)pIVar2[uVar7].pos.x,0),
                                             SUB84((double)pIVar2[uVar7].pos.y,0),
                                             (double)pIVar2[uVar7].uv.x,(double)pIVar2[uVar7].uv.y,
                                             pcVar10,(ulong)(uint)(iVar15 + (int)lVar9),
                                             (ulong)pIVar2[uVar7].col);
                      buf_00 = (ImVec4 *)((long)&buf_00->x + (long)iVar6);
                      lVar9 = lVar9 + 1;
                    } while (lVar9 != 3);
                    local_190.x = 0.0;
                    local_190.y = 0.0;
                    Selectable((char *)local_168,false,0,&local_190);
                    pIVar8 = local_1b8;
                    if ((local_1b8 != (ImDrawList *)0x0) && (bVar4 = IsItemHovered(0), bVar4)) {
                      uVar7 = pIVar8->Flags;
                      pIVar8->Flags = uVar7 & 0xfffffffe;
                      ImDrawList::AddPolyline(pIVar8,local_188,3,0xff00ffff,true,1.0);
                      pIVar8->Flags = uVar7;
                    }
                    iVar15 = iVar15 + 3;
                    uVar7 = (int)local_198 + 1;
                  } while (uVar7 != local_1a4);
                }
              }
              TreePop();
              uVar14 = local_1a0;
              pIVar16 = local_1b0;
              if ((float)local_1d8.ItemsCount != -NAN) {
                __assert_fail("ItemsCount == -1 && \"Forgot to call End(), or to Step() until false?\""
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                              ,0x8c6,"ImGuiListClipper::~ImGuiListClipper()");
              }
            }
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar16->UserCallback,pIVar16->UserCallbackData);
        }
        uVar14 = (ulong)((int)uVar14 + pIVar16->ElemCount);
        pIVar16 = pIVar16 + 1;
      } while (pIVar16 < (draw_list->CmdBuffer).Data + (draw_list->CmdBuffer).Size);
    }
  }
  TreePop();
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImGuiViewportP* viewport, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = viewport ? GetForegroundDrawList(viewport) : NULL; // Render additional visuals into the top-most draw list
            if (window && fg_draw_list && ImGui::IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

            unsigned int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }

                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
                    pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (ImGui::IsItemHovered() && (show_drawcmd_mesh || show_drawcmd_aabb) && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, elem_offset, show_drawcmd_mesh, show_drawcmd_aabb);
                if (!pcmd_node_open)
                    continue;

                // Calculate approximate coverage area (touched pixel count)
                // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
                float total_area = 0.0f;
                for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                {
                    ImVec2 triangle[3];
                    for (int n = 0; n < 3; n++)
                        triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
                }

                // Display vertex information summary. Hover to get all triangles drawn in wire-frame
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
                ImGui::Selectable(buf);
                if (ImGui::IsItemHovered() && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, elem_offset, true, false);

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper;
                clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
                    {
                        char* buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                            triangle[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }

                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }